

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texio.cpp
# Opt level: O0

void __thiscall tex_sentry::tex_sentry(tex_sentry *this,string *out_file_name)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  int *in_RDI;
  int tex_inputfd;
  int tex_outputfd;
  int trash_fd;
  int pipefd [2];
  int local_18;
  int local_14;
  
  *in_RDI = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  memset(&local_18,0,8);
  iVar1 = pipe(&local_18);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    in_RDI[4] = *piVar4;
  }
  else {
    _Var2 = fork();
    *in_RDI = _Var2;
    if (*in_RDI < 0) {
      piVar4 = __errno_location();
      in_RDI[4] = *piVar4;
    }
    else {
      if (*in_RDI == 0) {
        close(local_14);
        iVar1 = open("/dev/null",1);
        iVar3 = dup2(iVar1,1);
        if (iVar3 < 0) {
          close(iVar1);
          exit(1);
        }
        close(iVar1);
        iVar1 = dup2(local_18,0);
        if (iVar1 < 0) {
          close(local_18);
          exit(1);
        }
        close(local_18);
        uVar5 = std::__cxx11::string::c_str();
        execlp("pdflatex","pdflatex","-jobname",uVar5,0);
        exit(1);
      }
      close(local_18);
      pFVar6 = fdopen(local_14,"w");
      *(FILE **)(in_RDI + 2) = pFVar6;
      if (*(long *)(in_RDI + 2) == 0) {
        piVar4 = __errno_location();
        in_RDI[4] = *piVar4;
      }
    }
  }
  return;
}

Assistant:

tex_sentry::tex_sentry(const std::string& out_file_name) : tex_pid(0), tex_fo(nullptr), state(0)
{
    int pipefd[2] = {};
    if (pipe(pipefd) < 0) {
        state = errno;
        return;
    }
    tex_pid = fork();
    if (tex_pid < 0) { // Fork was not sucessful
        state = errno;
        return;
    } else if (tex_pid == 0) { // Child section
        close(pipefd[1]);
        int trash_fd = open("/dev/null", O_WRONLY);
        int tex_outputfd = dup2(trash_fd, STDOUT_FILENO);
        if (tex_outputfd < 0) {
            close(trash_fd);
            exit(1);
        }
        close(trash_fd);
        int tex_inputfd = dup2(pipefd[0], STDIN_FILENO);
        if (tex_inputfd < 0) {
            close(pipefd[0]);
            exit(1);
        }
        close(pipefd[0]);
        execlp("pdflatex", "pdflatex", "-jobname", out_file_name.c_str(), nullptr);
        exit(1);
    } // End of child section
    close(pipefd[0]);
    tex_fo = fdopen(pipefd[1], "w");
    if (tex_fo == nullptr)
        state = errno;
}